

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O2

void combine(vector<const_char_*,_std::allocator<const_char_*>_> *in,
            vector<const_char_*,_std::allocator<const_char_*>_> *views,char *outname,bool override)

{
  char *pcVar1;
  bool bVar2;
  pointer pHVar3;
  pointer pHVar4;
  _Alloc_hider _Var5;
  char cVar6;
  __type _Var7;
  int iVar8;
  int iVar9;
  MultiPartInputFile *pMVar10;
  Header *pHVar11;
  string *psVar12;
  ostream *poVar13;
  invalid_argument *this;
  ulong uVar14;
  size_t k;
  bool forcepartname;
  int partnum;
  MultiPartInputFile *infile;
  int local_2f0;
  allocator<char> local_2e9;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> headers;
  vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_> inputs;
  vector<int,_std::allocator<int>_> partnums;
  MultiPartOutputFile out;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_270;
  ulong local_268;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_260;
  MultiPartOutputFile temp;
  vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_> fordelete;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fornamecheck;
  string local_1f0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  Header h;
  ostream local_1a8 [376];
  
  local_268 = (long)(in->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  partnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  partnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  partnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inputs.
  super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.
  super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inputs.
  super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fordelete.
  super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fordelete.
  super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fordelete.
  super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fornamecheck.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fornamecheck.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fornamecheck.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar14 = 0;
  local_270 = in;
  local_260 = views;
  do {
    if (uVar14 == local_268) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1d0,&fornamecheck);
      filename_check(&local_1d0,outname);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d0);
      if (1 < local_268) {
        make_unique_names(&headers);
      }
      pHVar4 = headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pHVar3 = headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl
               .super__Vector_impl_data._M_start;
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                (&temp,outname,pHVar3,(int)(((long)pHVar4 - (long)pHVar3) / 0x38),override,iVar8);
      pHVar4 = headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pHVar3 = headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl
               .super__Vector_impl_data._M_start;
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                (&out,outname,pHVar3,(int)(((long)pHVar4 - (long)pHVar3) / 0x38),override,iVar8);
      for (uVar14 = 0; iVar8 = (int)uVar14,
          uVar14 < (ulong)((long)partnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)partnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2); uVar14 = uVar14 + 1) {
        psVar12 = (string *)Imf_3_4::Header::type_abi_cxx11_();
        std::__cxx11::string::string((string *)&h,psVar12);
        _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&h,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)Imf_3_4::SCANLINEIMAGE_abi_cxx11_);
        if (_Var7) {
          poVar13 = std::operator<<((ostream *)&std::cout,"part ");
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
          poVar13 = std::operator<<(poVar13,": ");
          poVar13 = std::operator<<(poVar13,"scanlineimage");
          std::endl<char,std::char_traits<char>>(poVar13);
          copy_scanline(inputs.
                        super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar14],&out,
                        partnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar14],iVar8);
        }
        else {
          _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&h,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)Imf_3_4::TILEDIMAGE_abi_cxx11_);
          if (_Var7) {
            poVar13 = std::operator<<((ostream *)&std::cout,"part ");
            poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
            poVar13 = std::operator<<(poVar13,": ");
            poVar13 = std::operator<<(poVar13,"tiledimage");
            std::endl<char,std::char_traits<char>>(poVar13);
            copy_tile(inputs.
                      super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar14],&out,
                      partnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar14],iVar8);
          }
          else {
            _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&h,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)Imf_3_4::DEEPSCANLINE_abi_cxx11_);
            if (_Var7) {
              poVar13 = std::operator<<((ostream *)&std::cout,"part ");
              poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
              poVar13 = std::operator<<(poVar13,": ");
              poVar13 = std::operator<<(poVar13,"deepscanlineimage");
              std::endl<char,std::char_traits<char>>(poVar13);
              copy_scanlinedeep(inputs.
                                super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar14],&out,
                                partnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar14],iVar8);
            }
            else {
              _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&h,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)Imf_3_4::DEEPTILE_abi_cxx11_);
              if (_Var7) {
                poVar13 = std::operator<<((ostream *)&std::cout,"part ");
                poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
                poVar13 = std::operator<<(poVar13,": ");
                poVar13 = std::operator<<(poVar13,"deeptile");
                std::endl<char,std::char_traits<char>>(poVar13);
                copy_tiledeep(inputs.
                              super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar14],&out,
                              partnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar14],iVar8);
              }
            }
          }
        }
        std::__cxx11::string::~string((string *)&h);
      }
      for (uVar14 = 0;
          uVar14 < (ulong)((long)fordelete.
                                 super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)fordelete.
                                 super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar14 = uVar14 + 1) {
        pMVar10 = fordelete.
                  super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar14];
        if (pMVar10 != (MultiPartInputFile *)0x0) {
          Imf_3_4::MultiPartInputFile::~MultiPartInputFile(pMVar10);
        }
        operator_delete(pMVar10,0x20);
      }
      if (inputs.
          super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          inputs.
          super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        inputs.
        super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             inputs.
             super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      poVar13 = std::operator<<((ostream *)&std::cout,"\n");
      poVar13 = std::operator<<(poVar13,"Combine Success");
      std::endl<char,std::char_traits<char>>(poVar13);
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&out);
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&temp);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&fornamecheck);
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&headers);
      std::
      _Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::
      ~_Vector_base(&fordelete.
                     super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                   );
      std::
      _Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::
      ~_Vector_base(&inputs.
                     super__Vector_base<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>
                   );
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&partnums.super__Vector_base<int,_std::allocator<int>_>);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&temp,
               (local_270->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar14],(allocator<char> *)&h);
    _out = (pointer)&local_280;
    local_280._M_local_buf[0] = '\0';
    parse_filename((string *)&temp,(string *)&out,&forcepartname,&partnum);
    if (partnum == -1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&fornamecheck,(string *)&temp);
      pMVar10 = (MultiPartInputFile *)operator_new(0x20);
      _Var5._M_p = _temp;
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartInputFile::MultiPartInputFile(pMVar10,_Var5._M_p,iVar8,true);
      infile = pMVar10;
      std::vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::
      push_back(&fordelete,&infile);
      iVar8 = Imf_3_4::MultiPartInputFile::parts();
      bVar2 = forcepartname;
      for (local_2f0 = 0; local_2f0 < iVar8; local_2f0 = local_2f0 + 1) {
        std::vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::
        push_back(&inputs,&infile);
        pHVar11 = (Header *)Imf_3_4::MultiPartInputFile::header((int)infile);
        Imf_3_4::Header::Header(&h,pHVar11);
        cVar6 = Imf_3_4::Header::hasName();
        if ((cVar6 == '\0') || ((bVar2 & 1U) != 0)) {
          Imf_3_4::Header::setName((string *)&h);
        }
        std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back(&headers,&h);
        pHVar3 = headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pcVar1 = (local_260->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar14];
        if (pcVar1 != (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>(local_1f0,pcVar1,&local_2e9);
          Imf_3_4::Header::setView((string *)(pHVar3 + -0x38));
          std::__cxx11::string::~string(local_1f0);
        }
        std::vector<int,_std::allocator<int>_>::push_back(&partnums,&local_2f0);
        Imf_3_4::Header::~Header(&h);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&fornamecheck,(string *)&temp);
      pMVar10 = (MultiPartInputFile *)operator_new(0x20);
      _Var5._M_p = _temp;
      iVar8 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartInputFile::MultiPartInputFile(pMVar10,_Var5._M_p,iVar8,true);
      infile = pMVar10;
      std::vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::
      push_back(&fordelete,&infile);
      iVar8 = partnum;
      iVar9 = Imf_3_4::MultiPartInputFile::parts();
      if (iVar9 <= iVar8) {
        std::__cxx11::stringstream::stringstream((stringstream *)&h);
        poVar13 = std::operator<<(local_1a8,"You asked for part ");
        poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,partnum);
        poVar13 = std::operator<<(poVar13," in ");
        poVar13 = std::operator<<(poVar13,(local_270->
                                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start[uVar14]);
        poVar13 = std::operator<<(poVar13,", which only has ");
        iVar8 = Imf_3_4::MultiPartInputFile::parts();
        poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,iVar8);
        std::operator<<(poVar13," parts");
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(this,local_1f0);
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      std::vector<Imf_3_4::MultiPartInputFile_*,_std::allocator<Imf_3_4::MultiPartInputFile_*>_>::
      push_back(&inputs,&infile);
      pHVar11 = (Header *)Imf_3_4::MultiPartInputFile::header((int)infile);
      Imf_3_4::Header::Header(&h,pHVar11);
      cVar6 = Imf_3_4::Header::hasName();
      if ((cVar6 == '\0') || (forcepartname == true)) {
        Imf_3_4::Header::setName((string *)&h);
      }
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back(&headers,&h);
      pHVar3 = headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pcVar1 = (local_260->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar14];
      if (pcVar1 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1f0,pcVar1,(allocator<char> *)&local_2f0);
        Imf_3_4::Header::setView((string *)(pHVar3 + -0x38));
        std::__cxx11::string::~string(local_1f0);
      }
      std::vector<int,_std::allocator<int>_>::push_back(&partnums,&partnum);
      Imf_3_4::Header::~Header(&h);
    }
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::~string((string *)&temp);
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void
combine (
    vector<const char*> in,
    vector<const char*> views,
    const char*         outname,
    bool                override)
{
    size_t                      numInputs = in.size ();
    int                         numparts;
    vector<int>                 partnums;
    vector<MultiPartInputFile*> inputs;
    vector<MultiPartInputFile*> fordelete;
    MultiPartInputFile*         infile;
    vector<Header>              headers;
    vector<string>              fornamecheck;

    //
    // parse all inputs
    //

    // Input format :
    // We support the following syntax for each input
    // <file>[:<partnum>][::<newpartname>]

    for (size_t i = 0; i < numInputs; i++)
    {
        string filename (in[i]);
        string partname;
        bool   forcepartname;
        int    partnum;
        parse_filename (filename, partname, forcepartname, partnum);

        if (partnum == -1)
        {
            fornamecheck.push_back (filename);

            infile = new MultiPartInputFile (filename.c_str ());
            fordelete.push_back (infile);
            numparts = infile->parts ();

            //copy header from all parts of input to our header array
            for (int j = 0; j < numparts; j++)
            {
                inputs.push_back (infile);

                Header h = infile->header (j);
                if (!h.hasName () || forcepartname) h.setName (partname);

                headers.push_back (h);

                if (views[i] != NULL)
                    headers[headers.size () - 1].setView (views[i]);

                partnums.push_back (j);
            }
        } // no user parts specified
        else
        {
            fornamecheck.push_back (filename);

            infile = new MultiPartInputFile (filename.c_str ());
            fordelete.push_back (infile);

            if (partnum >= infile->parts ())
            {
                std::stringstream e;
                e << "You asked for part " << partnum << " in " << in[i]
                  << ", which only has " << infile->parts () << " parts";
                throw invalid_argument (e.str ());
            }
            //copy header from required part of input to our header array
            inputs.push_back (infile);

            Header h = infile->header (partnum);
            if (!h.hasName () || forcepartname) h.setName (partname);

            headers.push_back (h);

            if (views[i] != NULL)
                headers[headers.size () - 1].setView (views[i]);

            partnums.push_back (partnum);
        } // user parts specified
    }

    filename_check (fornamecheck, outname);
    //
    // sort out names - make unique
    //
    if (numInputs > 1) { make_unique_names (headers); }

    //
    // do combine
    //

    // early bail if need be
    MultiPartOutputFile temp (outname, &headers[0], headers.size (), override);

    MultiPartOutputFile out (outname, &headers[0], headers.size (), override);

    for (size_t p = 0; p < partnums.size (); p++)
    {
        std::string type = headers[p].type ();
        if (type == SCANLINEIMAGE)
        {
            cout << "part " << p << ": "
                 << "scanlineimage" << endl;
            copy_scanline (*inputs[p], out, partnums[p], p);
        }
        else if (type == TILEDIMAGE)
        {
            cout << "part " << p << ": "
                 << "tiledimage" << endl;
            copy_tile (*inputs[p], out, partnums[p], p);
        }
        else if (type == DEEPSCANLINE)
        {
            cout << "part " << p << ": "
                 << "deepscanlineimage" << endl;
            copy_scanlinedeep (*inputs[p], out, partnums[p], p);
        }
        else if (type == DEEPTILE)
        {
            cout << "part " << p << ": "
                 << "deeptile" << endl;
            copy_tiledeep (*inputs[p], out, partnums[p], p);
        }
    }

    for (size_t k = 0; k < fordelete.size (); k++)
    {
        delete fordelete[k];
    }

    inputs.clear ();

    cout << "\n"
         << "Combine Success" << endl;
}